

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O1

QDate __thiscall QDate::addDays(QDate *this,qint64 ndays)

{
  long lVar1;
  QDate QVar2;
  long lVar3;
  
  lVar1 = this->jd;
  QVar2.jd = -0x8000000000000000;
  if (0xfffffe92c1eb868b < lVar1 - 0xb69f248055U) {
    lVar3 = lVar1 + ndays;
    if (lVar3 - 0xb69f248055U < 0xfffffe92c1eb868c) {
      lVar3 = -0x8000000000000000;
    }
    if (!SCARRY8(lVar1,ndays)) {
      QVar2.jd = lVar3;
    }
  }
  return (QDate)QVar2.jd;
}

Assistant:

QDate QDate::addDays(qint64 ndays) const
{
    if (isNull())
        return QDate();

    if (qint64 r; Q_UNLIKELY(qAddOverflow(jd, ndays, &r)))
        return QDate();
    else
        return fromJulianDay(r);
}